

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O2

RelationStats *
duckdb::RelationStatisticsHelper::ExtractGetStats
          (RelationStats *__return_storage_ptr__,LogicalGet *get,ClientContext *context)

{
  ulong __n;
  table_statistics_t p_Var1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var2;
  byte bVar3;
  RelationStats *pRVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  vector<duckdb::ColumnIndex,_true> *this;
  const_reference pvVar7;
  pointer this_00;
  idx_t iVar8;
  reference __rhs;
  type filter;
  type base_stats;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar9;
  pointer pTVar10;
  _Base_ptr p_Var11;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar12;
  ClientContext *this_01;
  ulong uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
  column_statistics;
  optional_ptr<duckdb::TableCatalogEntry,_true> catalog_table;
  string column_name;
  DistinctCount column_distinct_count;
  DistinctCount column_distinct_count_1;
  string name;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> local_120;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_118;
  RelationStats *local_110;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_108;
  _Rb_tree_node_base *local_100;
  ClientContext *local_f8;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_f0;
  undefined1 local_e8 [40];
  undefined1 local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_110 = __return_storage_ptr__;
  RelationStats::RelationStats(__return_storage_ptr__);
  local_f8 = context;
  iVar6 = (*(get->super_LogicalOperator)._vptr_LogicalOperator[7])(get,context);
  local_120._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
       (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)0x0
  ;
  local_f0 = LogicalGet::GetTable(get);
  ::std::__cxx11::string::string((string *)&local_70,"some table",(allocator *)local_e8);
  if (local_f0.ptr != (TableCatalogEntry *)0x0) {
    optional_ptr<duckdb::TableCatalogEntry,_true>::operator->(&local_f0);
    ::std::__cxx11::string::_M_assign((string *)&local_70);
    ::std::__cxx11::string::_M_assign((string *)&local_110->table_name);
  }
  local_e8._32_8_ = LogicalGet::GetTable(get);
  local_108 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              CONCAT44(extraout_var,iVar6);
  this = LogicalGet::GetColumnIds(get);
  local_118 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &local_110->column_names;
  local_100 = (_Rb_tree_node_base *)&get->names;
  uVar13 = 0;
  do {
    if ((ulong)((long)(this->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                      ).
                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                      ).
                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 5) <= uVar13) {
      pvVar9 = local_108;
      if ((get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        local_e8._0_8_ = (element_type *)0x0;
        bVar3 = 0;
        ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
        ::reset(&local_120,(pointer)0x0);
        ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
        ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                     *)local_e8);
        p_Var11 = (get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_100 = &(get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header;
        local_118 = local_108;
        for (; p_Var11 != local_100; p_Var11 = (_Base_ptr)::std::_Rb_tree_increment(p_Var11)) {
          _Var2._M_head_impl =
               (get->bind_data).
               super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
          if ((_Var2._M_head_impl != (FunctionData *)0x0) &&
             (p_Var1 = (get->function).statistics, p_Var1 != (table_statistics_t)0x0)) {
            (*p_Var1)((ClientContext *)local_e8,(FunctionData *)local_f8,
                      (column_t)_Var2._M_head_impl);
            uVar5 = local_e8._0_8_;
            local_e8._0_8_ = (element_type *)0x0;
            ::std::
            __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
            reset(&local_120,(pointer)uVar5);
            ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
            ::~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                           *)local_e8);
          }
          if (local_120._M_t.
              super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
              .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
              (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
               )0x0) {
            iVar8 = *(idx_t *)(p_Var11 + 1);
            filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                     ::operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                                  *)&p_Var11[1]._M_parent);
            base_stats = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                         ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                      *)&local_120);
            pvVar9 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     InspectTableFilter((idx_t)local_108,iVar8,filter,base_stats);
            if (pvVar9 <= local_118) {
              local_118 = pvVar9;
            }
          }
          pTVar10 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    ::operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                                  *)&p_Var11[1]._M_parent);
          bVar3 = bVar3 | pTVar10->filter_type != OPTIONAL_FILTER;
        }
        pvVar12 = local_118;
        if ((bool)(local_118 == local_108 & bVar3)) {
          auVar14._8_4_ = (int)((ulong)local_108 >> 0x20);
          auVar14._0_8_ = local_108;
          auVar14._12_4_ = 0x45300000;
          dVar15 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_108) - 4503599627370496.0)) * 0.2;
          uVar13 = (ulong)dVar15;
          uVar13 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13;
          pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                    (uVar13 + (uVar13 == 0));
        }
        pvVar9 = local_108;
        if (local_108 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
          pvVar9 = pvVar12;
        }
      }
      pRVar4 = local_110;
      local_110->cardinality = (idx_t)pvVar9;
      (get->super_LogicalOperator).estimated_cardinality = (idx_t)pvVar9;
      (get->super_LogicalOperator).has_estimated_cardinality = true;
      local_110->stats_initialized = true;
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   *)&local_120);
      return pRVar4;
    }
    pvVar7 = vector<duckdb::ColumnIndex,_true>::get<true>(this,uVar13);
    __n = pvVar7->index;
    p_Var1 = (get->function).statistics;
    if (p_Var1 == (table_statistics_t)0x0) {
LAB_00a3f359:
      local_80._0_8_ = local_108;
      local_80[8] = '\0';
      ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::push_back
                ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)local_110,
                 (value_type *)local_80);
      ::std::__cxx11::string::string((string *)local_e8,"column",(allocator *)local_c0);
      if (__n < (ulong)((long)(get->names).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(get->names).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_100,__n);
        ::std::__cxx11::string::_M_assign((string *)local_e8);
      }
      (*(get->super_LogicalOperator)._vptr_LogicalOperator[3])(&local_50,get);
      ::std::operator+(&local_a0,&local_50,".");
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,&local_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                      );
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                (local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      ::std::__cxx11::string::~string((string *)local_c0);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::__cxx11::string::~string((string *)&local_50);
      this_01 = (ClientContext *)local_e8;
    }
    else {
      (*p_Var1)((ClientContext *)local_e8,(FunctionData *)local_f8,
                (column_t)
                (get->bind_data).
                super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
                _M_t.
                super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
      uVar5 = local_e8._0_8_;
      local_e8._0_8_ = (element_type *)0x0;
      ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
      reset(&local_120,(pointer)uVar5);
      ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   *)local_e8);
      if (((TableCatalogEntry *)local_e8._32_8_ == (TableCatalogEntry *)0x0) ||
         (local_120._M_t.
          super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
          .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl ==
          (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
          0x0)) goto LAB_00a3f359;
      this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                              *)&local_120);
      iVar8 = BaseStatistics::GetDistinctCount(this_00);
      local_a0._M_dataplus._M_p = (pointer)(iVar8 + (iVar8 == 0));
      local_a0._M_string_length._0_1_ = '\x01';
      ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::push_back
                ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)local_110,
                 (value_type *)&local_a0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,&local_70,".");
      __rhs = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_100,__n);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_c0,__rhs);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                (local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
      ::std::__cxx11::string::~string((string *)local_e8);
      this_01 = (ClientContext *)local_c0;
    }
    ::std::__cxx11::string::~string((string *)this_01);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

RelationStats RelationStatisticsHelper::ExtractGetStats(LogicalGet &get, ClientContext &context) {
	auto return_stats = RelationStats();

	auto base_table_cardinality = get.EstimateCardinality(context);
	auto cardinality_after_filters = base_table_cardinality;
	unique_ptr<BaseStatistics> column_statistics;

	auto catalog_table = get.GetTable();
	auto name = string("some table");
	if (catalog_table) {
		name = catalog_table->name;
		return_stats.table_name = name;
	}

	// if we can get the catalog table, then our column statistics will be accurate
	// parquet readers etc. will still return statistics, but they initialize distinct column
	// counts to 0.
	// TODO: fix this, some file formats can encode distinct counts, we don't want to rely on
	//  getting a catalog table to know that we can use statistics.
	bool have_catalog_table_statistics = false;
	if (get.GetTable()) {
		have_catalog_table_statistics = true;
	}

	// first push back basic distinct counts for each column (if we have them).
	auto &column_ids = get.GetColumnIds();
	for (idx_t i = 0; i < column_ids.size(); i++) {
		auto column_id = column_ids[i].GetPrimaryIndex();
		bool have_distinct_count_stats = false;
		if (get.function.statistics) {
			column_statistics = get.function.statistics(context, get.bind_data.get(), column_id);
			if (column_statistics && have_catalog_table_statistics) {
				auto distinct_count = MaxValue<idx_t>(1, column_statistics->GetDistinctCount());
				auto column_distinct_count = DistinctCount({distinct_count, true});
				return_stats.column_distinct_count.push_back(column_distinct_count);
				return_stats.column_names.push_back(name + "." + get.names.at(column_id));
				have_distinct_count_stats = true;
			}
		}
		if (!have_distinct_count_stats) {
			// currently treating the cardinality as the distinct count.
			// the cardinality estimator will update these distinct counts based
			// on the extra columns that are joined on.
			auto column_distinct_count = DistinctCount({cardinality_after_filters, false});
			return_stats.column_distinct_count.push_back(column_distinct_count);
			auto column_name = string("column");
			if (column_id < get.names.size()) {
				column_name = get.names.at(column_id);
			}
			return_stats.column_names.push_back(get.GetName() + "." + column_name);
		}
	}

	if (!get.table_filters.filters.empty()) {
		column_statistics = nullptr;
		bool has_non_optional_filters = false;
		for (auto &it : get.table_filters.filters) {
			if (get.bind_data && get.function.statistics) {
				column_statistics = get.function.statistics(context, get.bind_data.get(), it.first);
			}

			if (column_statistics) {
				idx_t cardinality_with_filter =
				    InspectTableFilter(base_table_cardinality, it.first, *it.second, *column_statistics);
				cardinality_after_filters = MinValue(cardinality_after_filters, cardinality_with_filter);
			}

			if (it.second->filter_type != TableFilterType::OPTIONAL_FILTER) {
				has_non_optional_filters = true;
			}
		}
		// if the above code didn't find an equality filter (i.e country_code = "[us]")
		// and there are other table filters (i.e cost > 50), use default selectivity.
		bool has_equality_filter = (cardinality_after_filters != base_table_cardinality);
		if (!has_equality_filter && has_non_optional_filters) {
			cardinality_after_filters = MaxValue<idx_t>(
			    LossyNumericCast<idx_t>(double(base_table_cardinality) * RelationStatisticsHelper::DEFAULT_SELECTIVITY),
			    1U);
		}
		if (base_table_cardinality == 0) {
			cardinality_after_filters = 0;
		}
	}
	return_stats.cardinality = cardinality_after_filters;
	// update the estimated cardinality of the get as well.
	// This is not updated during plan reconstruction.
	get.estimated_cardinality = cardinality_after_filters;
	get.has_estimated_cardinality = true;
	D_ASSERT(base_table_cardinality >= cardinality_after_filters);
	return_stats.stats_initialized = true;
	return return_stats;
}